

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall wasm::Literal::truncSatToUI64(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  bool bVar2;
  float fVar3;
  ulong uVar4;
  double dVar5;
  size_t sVar6;
  Literal local_50;
  Literal local_38;
  double local_20;
  
  uVar1 = (this->type).id;
  if (uVar1 == 5) {
    Literal(&local_50,this);
    castToI64(&local_38,&local_50);
    dVar5 = (double)geti64(&local_38);
    local_20 = dVar5;
    if (NAN(dVar5)) {
      sVar6 = 0;
    }
    else {
      bVar2 = isInRangeI64TruncU((int64_t)dVar5);
      if (bVar2) {
        dVar5 = ::trunc(local_20);
        sVar6 = (long)(dVar5 - 9.223372036854776e+18) & (long)dVar5 >> 0x3f | (long)dVar5;
      }
      else {
        sVar6 = (long)~(ulong)dVar5 >> 0x3f;
      }
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len = sVar6;
  }
  else {
    if (uVar1 != 4) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x338);
    }
    Literal(&local_50,this);
    castToI32(&local_38,&local_50);
    fVar3 = (float)geti32(&local_38);
    local_20 = (double)CONCAT44(local_20._4_4_,fVar3);
    if (NAN(fVar3)) {
      uVar4 = 0;
    }
    else {
      bVar2 = isInRangeI64TruncU((int32_t)fVar3);
      if (bVar2) {
        fVar3 = truncf(local_20._0_4_);
        uVar4 = (long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3;
      }
      else {
        uVar4 = -(ulong)(-1 < (int)fVar3);
      }
    }
    (__return_storage_ptr__->field_0).func.super_IString.str._M_len = uVar4;
  }
  (__return_storage_ptr__->type).id = 3;
  ~Literal(&local_38);
  ~Literal(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::truncSatToUI64() const {
  if (type == Type::f32) {
    return saturating_trunc<float, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI32().geti32());
  }
  if (type == Type::f64) {
    return saturating_trunc<double, uint64_t, isInRangeI64TruncU>(
      Literal(*this).castToI64().geti64());
  }
  WASM_UNREACHABLE("invalid type");
}